

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSeqTable(ZSTD_seqSymbol *DTableSpace,ZSTD_seqSymbol **DTablePtr,
                         symbolEncodingType_e type,uint max,U32 maxLog,void *src,size_t srcSize,
                         U32 *baseValue,U32 *nbAdditionalBits,ZSTD_seqSymbol *defaultTable,
                         U32 flagRepeatTable,int ddictIsCold,int nbSeq)

{
  uint uVar1;
  ZSTD_seqSymbol *code;
  size_t headerSize;
  S16 norm [53];
  uint local_74;
  ulong uStack_70;
  uint tableLog;
  size_t _pos;
  size_t _size;
  char *_ptr;
  size_t pSize;
  void *pStart;
  U32 local_40;
  U32 nbBits;
  U32 baseline;
  U32 symbol;
  void *src_local;
  uint local_28;
  U32 maxLog_local;
  uint max_local;
  symbolEncodingType_e type_local;
  ZSTD_seqSymbol **DTablePtr_local;
  ZSTD_seqSymbol *DTableSpace_local;
  
  _baseline = src;
  src_local._4_4_ = maxLog;
  local_28 = max;
  maxLog_local = type;
  _max_local = DTablePtr;
  DTablePtr_local = (ZSTD_seqSymbol **)DTableSpace;
  switch(type) {
  case set_basic:
    *DTablePtr = defaultTable;
    DTableSpace_local = (ZSTD_seqSymbol *)0x0;
    break;
  case set_rle:
    if (srcSize == 0) {
      DTableSpace_local = (ZSTD_seqSymbol *)0xffffffffffffffb8;
    }
    else if (max < *src) {
      DTableSpace_local = (ZSTD_seqSymbol *)0xffffffffffffffec;
    }
    else {
      nbBits = (U32)*src;
      local_40 = baseValue[nbBits];
      pStart._4_4_ = nbAdditionalBits[nbBits];
      ZSTD_buildSeqTable_rle(DTableSpace,local_40,pStart._4_4_);
      *_max_local = (ZSTD_seqSymbol *)DTablePtr_local;
      DTableSpace_local = (ZSTD_seqSymbol *)0x1;
    }
    break;
  case set_compressed:
    code = (ZSTD_seqSymbol *)FSE_readNCount((short *)&headerSize,&local_28,&local_74,src,srcSize);
    uVar1 = ERR_isError((size_t)code);
    if (uVar1 == 0) {
      if (src_local._4_4_ < local_74) {
        DTableSpace_local = (ZSTD_seqSymbol *)0xffffffffffffffec;
      }
      else {
        ZSTD_buildFSETable((ZSTD_seqSymbol *)DTablePtr_local,(short *)&headerSize,local_28,baseValue
                           ,nbAdditionalBits,local_74);
        *_max_local = (ZSTD_seqSymbol *)DTablePtr_local;
        DTableSpace_local = code;
      }
    }
    else {
      DTableSpace_local = (ZSTD_seqSymbol *)0xffffffffffffffec;
    }
    break;
  case set_repeat:
    if (flagRepeatTable == 0) {
      DTableSpace_local = (ZSTD_seqSymbol *)0xffffffffffffffec;
    }
    else {
      if ((ddictIsCold != 0) && (0x18 < nbSeq)) {
        for (uStack_70 = 0; uStack_70 < (ulong)((long)((1 << ((byte)maxLog & 0x1f)) + 1) << 3);
            uStack_70 = uStack_70 + 0x40) {
        }
      }
      DTableSpace_local = (ZSTD_seqSymbol *)0x0;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6294,
                  "size_t ZSTD_buildSeqTable(ZSTD_seqSymbol *, const ZSTD_seqSymbol **, symbolEncodingType_e, unsigned int, U32, const void *, size_t, const U32 *, const U32 *, const ZSTD_seqSymbol *, U32, int, int)"
                 );
  }
  return (size_t)DTableSpace_local;
}

Assistant:

static size_t ZSTD_buildSeqTable(ZSTD_seqSymbol* DTableSpace, const ZSTD_seqSymbol** DTablePtr,
                                 symbolEncodingType_e type, unsigned max, U32 maxLog,
                                 const void* src, size_t srcSize,
                                 const U32* baseValue, const U32* nbAdditionalBits,
                                 const ZSTD_seqSymbol* defaultTable, U32 flagRepeatTable,
                                 int ddictIsCold, int nbSeq)
{
    switch(type)
    {
    case set_rle :
        RETURN_ERROR_IF(!srcSize, srcSize_wrong);
        RETURN_ERROR_IF((*(const BYTE*)src) > max, corruption_detected);
        {   U32 const symbol = *(const BYTE*)src;
            U32 const baseline = baseValue[symbol];
            U32 const nbBits = nbAdditionalBits[symbol];
            ZSTD_buildSeqTable_rle(DTableSpace, baseline, nbBits);
        }
        *DTablePtr = DTableSpace;
        return 1;
    case set_basic :
        *DTablePtr = defaultTable;
        return 0;
    case set_repeat:
        RETURN_ERROR_IF(!flagRepeatTable, corruption_detected);
        /* prefetch FSE table if used */
        if (ddictIsCold && (nbSeq > 24 /* heuristic */)) {
            const void* const pStart = *DTablePtr;
            size_t const pSize = sizeof(ZSTD_seqSymbol) * (SEQSYMBOL_TABLE_SIZE(maxLog));
            PREFETCH_AREA(pStart, pSize);
        }
        return 0;
    case set_compressed :
        {   unsigned tableLog;
            S16 norm[MaxSeq+1];
            size_t const headerSize = FSE_readNCount(norm, &max, &tableLog, src, srcSize);
            RETURN_ERROR_IF(FSE_isError(headerSize), corruption_detected);
            RETURN_ERROR_IF(tableLog > maxLog, corruption_detected);
            ZSTD_buildFSETable(DTableSpace, norm, max, baseValue, nbAdditionalBits, tableLog);
            *DTablePtr = DTableSpace;
            return headerSize;
        }
    default :
        assert(0);
        RETURN_ERROR(GENERIC, "impossible");
    }
}